

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsFieldCompare(FmsField lhs,FmsField rhs)

{
  int iVar1;
  FmsInt FVar2;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  FmsInt nDofs;
  FmsInt nvdim;
  int diff;
  void *in_stack_00000050;
  void *in_stack_00000058;
  FmsInt in_stack_00000060;
  FmsScalarType in_stack_0000006c;
  FmsFieldDescriptor in_stack_ffffffffffffffd0;
  FmsFieldDescriptor in_stack_ffffffffffffffd8;
  uint local_1c;
  uint local_4;
  
  if (in_RDI == in_RSI) {
    local_4 = 0;
  }
  else if (in_RDI == (undefined8 *)0x0) {
    local_4 = 0xffffffff;
  }
  else if (in_RSI == (undefined8 *)0x0) {
    local_4 = 0xfffffffe;
  }
  else {
    iVar1 = strcmp((char *)*in_RDI,(char *)*in_RSI);
    local_1c = (uint)(iVar1 != 0);
    iVar1 = FmsFieldDescriptorCompare(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (iVar1 != 0) {
      local_1c = local_1c + 10;
    }
    if (in_RDI[3] != in_RSI[3]) {
      local_1c = local_1c + 100;
    }
    if (*(int *)((long)in_RDI + 0x24) != *(int *)((long)in_RSI + 0x24)) {
      local_1c = local_1c + 1000;
    }
    if (*(int *)(in_RDI + 4) != *(int *)(in_RSI + 4)) {
      local_1c = local_1c + 10000;
    }
    if ((local_1c == 0) &&
       (FVar2 = CompareScalarData(in_stack_0000006c,in_stack_00000060,in_stack_00000058,
                                  in_stack_00000050), FVar2 != 0)) {
      local_1c = 100000;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int FmsFieldCompare(FmsField lhs, FmsField rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;

  if(strcmp(lhs->name, rhs->name)) {
    diff += 1;
  }

  if(FmsFieldDescriptorCompare(lhs->fd, rhs->fd)) {
    diff += 10;
  }

  if(lhs->num_vec_comp != rhs->num_vec_comp) {
    diff += 100;
  }

  if(lhs->scalar_type != rhs->scalar_type) {
    diff += 1000;
  }

  // Potentially shouldn't care about layout?
  if(lhs->layout != rhs->layout) {
    diff += 10000;
  }

  // Only compare the data arrays if everything has matched so far
  if(diff == 0) {
    FmsInt nvdim = lhs->num_vec_comp;
    FmsInt nDofs = 0;
    if(lhs->fd)
      nDofs = lhs->fd->num_dofs;
    if(CompareScalarData(lhs->scalar_type, nvdim * nDofs, lhs->data, rhs->data))
      diff += 100000;
  }

  return diff;
}